

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::internal::DecodeMacCounters
                  (Error *__return_storage_ptr__,MacCounters *aMacCounters,ByteArray *aBuf)

{
  uint8_t *aBuf_00;
  uint uVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aBuf_00 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)aBuf_00 == 0x24) {
    uVar1 = utils::Decode<unsigned_int>(aBuf_00,4);
    aMacCounters->mIfInUnknownProtos = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 4,4);
    aMacCounters->mIfInErrors = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 8,4);
    aMacCounters->mIfOutErrors = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0xc,4);
    aMacCounters->mIfInUcastPkts = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x10,4);
    aMacCounters->mIfInBroadcastPkts = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x14,4);
    aMacCounters->mIfInDiscards = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x18,4);
    aMacCounters->mIfOutUcastPkts = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x1c,4);
    aMacCounters->mIfOutBroadcastPkts = uVar1;
    uVar1 = utils::Decode<unsigned_int>
                      ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x20,4);
    aMacCounters->mIfOutDiscards = uVar1;
  }
  else {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "incorrect size of MacCounters";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1d;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar2 = "incorrect size of MacCounters";
    local_58.context_.types_ = local_58.types_;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_58);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"incorrect size of MacCounters",(string_view)ZEXT816(0x1d),args);
    local_80._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
    Error::operator=(__return_storage_ptr__,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeMacCounters(MacCounters &aMacCounters, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    VerifyOrExit(length == kMacCountersBytes, error = ERROR_BAD_FORMAT("incorrect size of MacCounters"));
    aMacCounters.mIfInUnknownProtos  = utils::Decode<uint32_t>(aBuf.data(), 4);
    aMacCounters.mIfInErrors         = utils::Decode<uint32_t>(aBuf.data() + 4, 4);
    aMacCounters.mIfOutErrors        = utils::Decode<uint32_t>(aBuf.data() + 8, 4);
    aMacCounters.mIfInUcastPkts      = utils::Decode<uint32_t>(aBuf.data() + 12, 4);
    aMacCounters.mIfInBroadcastPkts  = utils::Decode<uint32_t>(aBuf.data() + 16, 4);
    aMacCounters.mIfInDiscards       = utils::Decode<uint32_t>(aBuf.data() + 20, 4);
    aMacCounters.mIfOutUcastPkts     = utils::Decode<uint32_t>(aBuf.data() + 24, 4);
    aMacCounters.mIfOutBroadcastPkts = utils::Decode<uint32_t>(aBuf.data() + 28, 4);
    aMacCounters.mIfOutDiscards      = utils::Decode<uint32_t>(aBuf.data() + 32, 4);

exit:
    return error;
}